

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOfPdu.cpp
# Opt level: O1

void __thiscall DIS::IsGroupOfPdu::IsGroupOfPdu(IsGroupOfPdu *this)

{
  EntityManagementFamilyPdu::EntityManagementFamilyPdu(&this->super_EntityManagementFamilyPdu);
  (this->super_EntityManagementFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__IsGroupOfPdu_001a0520;
  EntityID::EntityID(&this->_groupEntityID);
  this->_groupedEntityCategory = '\0';
  this->_numberOfGroupedEntities = '\0';
  *(undefined8 *)&this->_pad2 = 0;
  *(undefined8 *)((long)&this->_latitude + 4) = 0;
  *(undefined8 *)((long)&this->_longitude + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_groupedEntityDescriptions).
           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  (this->_groupedEntityDescriptions).
  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_groupedEntityDescriptions).
  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Pdu::setPduType((Pdu *)this,'\"');
  return;
}

Assistant:

IsGroupOfPdu::IsGroupOfPdu() : EntityManagementFamilyPdu(),
   _groupEntityID(), 
   _groupedEntityCategory(0), 
   _numberOfGroupedEntities(0), 
   _pad2(0), 
   _latitude(0.0), 
   _longitude(0.0)
{
    setPduType( 34 );
}